

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O1

void StoreCommands(MemoryManager *m,uint8_t *literals,size_t num_literals,uint32_t *commands,
                  size_t num_commands,size_t *storage_ix,uint8_t *storage)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t cmd_depths [128];
  uint16_t cmd_bits [128];
  uint8_t cmd_depth [704];
  uint32_t cmd_histo [128];
  uint8_t lit_depths [256];
  uint16_t cmd_bits_1 [64];
  uint16_t lit_bits [256];
  uint32_t lit_histo [256];
  HuffmanTree tree [129];
  
  memset(lit_histo,0,0x400);
  cmd_depths[0x70] = '\0';
  cmd_depths[0x71] = '\0';
  cmd_depths[0x72] = '\0';
  cmd_depths[0x73] = '\0';
  cmd_depths[0x74] = '\0';
  cmd_depths[0x75] = '\0';
  cmd_depths[0x76] = '\0';
  cmd_depths[0x77] = '\0';
  cmd_depths[0x78] = '\0';
  cmd_depths[0x79] = '\0';
  cmd_depths[0x7a] = '\0';
  cmd_depths[0x7b] = '\0';
  cmd_depths[0x7c] = '\0';
  cmd_depths[0x7d] = '\0';
  cmd_depths[0x7e] = '\0';
  cmd_depths[0x7f] = '\0';
  cmd_depths[0x60] = '\0';
  cmd_depths[0x61] = '\0';
  cmd_depths[0x62] = '\0';
  cmd_depths[99] = '\0';
  cmd_depths[100] = '\0';
  cmd_depths[0x65] = '\0';
  cmd_depths[0x66] = '\0';
  cmd_depths[0x67] = '\0';
  cmd_depths[0x68] = '\0';
  cmd_depths[0x69] = '\0';
  cmd_depths[0x6a] = '\0';
  cmd_depths[0x6b] = '\0';
  cmd_depths[0x6c] = '\0';
  cmd_depths[0x6d] = '\0';
  cmd_depths[0x6e] = '\0';
  cmd_depths[0x6f] = '\0';
  cmd_depths[0x50] = '\0';
  cmd_depths[0x51] = '\0';
  cmd_depths[0x52] = '\0';
  cmd_depths[0x53] = '\0';
  cmd_depths[0x54] = '\0';
  cmd_depths[0x55] = '\0';
  cmd_depths[0x56] = '\0';
  cmd_depths[0x57] = '\0';
  cmd_depths[0x58] = '\0';
  cmd_depths[0x59] = '\0';
  cmd_depths[0x5a] = '\0';
  cmd_depths[0x5b] = '\0';
  cmd_depths[0x5c] = '\0';
  cmd_depths[0x5d] = '\0';
  cmd_depths[0x5e] = '\0';
  cmd_depths[0x5f] = '\0';
  cmd_depths[0x40] = '\0';
  cmd_depths[0x41] = '\0';
  cmd_depths[0x42] = '\0';
  cmd_depths[0x43] = '\0';
  cmd_depths[0x44] = '\0';
  cmd_depths[0x45] = '\0';
  cmd_depths[0x46] = '\0';
  cmd_depths[0x47] = '\0';
  cmd_depths[0x48] = '\0';
  cmd_depths[0x49] = '\0';
  cmd_depths[0x4a] = '\0';
  cmd_depths[0x4b] = '\0';
  cmd_depths[0x4c] = '\0';
  cmd_depths[0x4d] = '\0';
  cmd_depths[0x4e] = '\0';
  cmd_depths[0x4f] = '\0';
  cmd_depths[0x30] = '\0';
  cmd_depths[0x31] = '\0';
  cmd_depths[0x32] = '\0';
  cmd_depths[0x33] = '\0';
  cmd_depths[0x34] = '\0';
  cmd_depths[0x35] = '\0';
  cmd_depths[0x36] = '\0';
  cmd_depths[0x37] = '\0';
  cmd_depths[0x38] = '\0';
  cmd_depths[0x39] = '\0';
  cmd_depths[0x3a] = '\0';
  cmd_depths[0x3b] = '\0';
  cmd_depths[0x3c] = '\0';
  cmd_depths[0x3d] = '\0';
  cmd_depths[0x3e] = '\0';
  cmd_depths[0x3f] = '\0';
  cmd_depths[0x20] = '\0';
  cmd_depths[0x21] = '\0';
  cmd_depths[0x22] = '\0';
  cmd_depths[0x23] = '\0';
  cmd_depths[0x24] = '\0';
  cmd_depths[0x25] = '\0';
  cmd_depths[0x26] = '\0';
  cmd_depths[0x27] = '\0';
  cmd_depths[0x28] = '\0';
  cmd_depths[0x29] = '\0';
  cmd_depths[0x2a] = '\0';
  cmd_depths[0x2b] = '\0';
  cmd_depths[0x2c] = '\0';
  cmd_depths[0x2d] = '\0';
  cmd_depths[0x2e] = '\0';
  cmd_depths[0x2f] = '\0';
  cmd_depths[0x10] = '\0';
  cmd_depths[0x11] = '\0';
  cmd_depths[0x12] = '\0';
  cmd_depths[0x13] = '\0';
  cmd_depths[0x14] = '\0';
  cmd_depths[0x15] = '\0';
  cmd_depths[0x16] = '\0';
  cmd_depths[0x17] = '\0';
  cmd_depths[0x18] = '\0';
  cmd_depths[0x19] = '\0';
  cmd_depths[0x1a] = '\0';
  cmd_depths[0x1b] = '\0';
  cmd_depths[0x1c] = '\0';
  cmd_depths[0x1d] = '\0';
  cmd_depths[0x1e] = '\0';
  cmd_depths[0x1f] = '\0';
  cmd_depths[0] = '\0';
  cmd_depths[1] = '\0';
  cmd_depths[2] = '\0';
  cmd_depths[3] = '\0';
  cmd_depths[4] = '\0';
  cmd_depths[5] = '\0';
  cmd_depths[6] = '\0';
  cmd_depths[7] = '\0';
  cmd_depths[8] = '\0';
  cmd_depths[9] = '\0';
  cmd_depths[10] = '\0';
  cmd_depths[0xb] = '\0';
  cmd_depths[0xc] = '\0';
  cmd_depths[0xd] = '\0';
  cmd_depths[0xe] = '\0';
  cmd_depths[0xf] = '\0';
  memset(cmd_bits,0,0x100);
  memset(cmd_histo,0,0x200);
  if (num_literals != 0) {
    sVar4 = 0;
    do {
      lit_histo[literals[sVar4]] = lit_histo[literals[sVar4]] + 1;
      sVar4 = sVar4 + 1;
    } while (num_literals != sVar4);
  }
  BrotliBuildAndStoreHuffmanTreeFast
            (m,lit_histo,num_literals,8,lit_depths,lit_bits,storage_ix,storage);
  if (num_commands != 0) {
    sVar4 = 0;
    do {
      cmd_histo[(byte)commands[sVar4]] = cmd_histo[(byte)commands[sVar4]] + 1;
      sVar4 = sVar4 + 1;
    } while (num_commands != sVar4);
  }
  cmd_histo[1] = cmd_histo[1] + 1;
  cmd_histo[2] = cmd_histo[2] + 1;
  cmd_histo[0x40] = cmd_histo[0x40] + 1;
  cmd_histo[0x54] = cmd_histo[0x54] + 1;
  lVar10 = 0;
  memset(cmd_depth,0,0x2c0);
  BrotliCreateHuffmanTree(cmd_histo,0x40,0xf,tree,cmd_depths);
  BrotliCreateHuffmanTree(cmd_histo + 0x40,0x40,0xe,tree,cmd_depths + 0x40);
  cmd_depth[0x10] = cmd_depths[0x28];
  cmd_depth[0x11] = cmd_depths[0x29];
  cmd_depth[0x12] = cmd_depths[0x2a];
  cmd_depth[0x13] = cmd_depths[0x2b];
  cmd_depth[0x14] = cmd_depths[0x2c];
  cmd_depth[0x15] = cmd_depths[0x2d];
  cmd_depth[0x16] = cmd_depths[0x2e];
  cmd_depth[0x17] = cmd_depths[0x2f];
  cmd_depth[0] = cmd_depths[0x18];
  cmd_depth[1] = cmd_depths[0x19];
  cmd_depth[2] = cmd_depths[0x1a];
  cmd_depth[3] = cmd_depths[0x1b];
  cmd_depth[4] = cmd_depths[0x1c];
  cmd_depth[5] = cmd_depths[0x1d];
  cmd_depth[6] = cmd_depths[0x1e];
  cmd_depth[7] = cmd_depths[0x1f];
  cmd_depth[8] = cmd_depths[0x20];
  cmd_depth[9] = cmd_depths[0x21];
  cmd_depth[10] = cmd_depths[0x22];
  cmd_depth[0xb] = cmd_depths[0x23];
  cmd_depth[0xc] = cmd_depths[0x24];
  cmd_depth[0xd] = cmd_depths[0x25];
  cmd_depth[0xe] = cmd_depths[0x26];
  cmd_depth[0xf] = cmd_depths[0x27];
  cmd_depth[0x18] = cmd_depths[0];
  cmd_depth[0x19] = cmd_depths[1];
  cmd_depth[0x1a] = cmd_depths[2];
  cmd_depth[0x1b] = cmd_depths[3];
  cmd_depth[0x1c] = cmd_depths[4];
  cmd_depth[0x1d] = cmd_depths[5];
  cmd_depth[0x1e] = cmd_depths[6];
  cmd_depth[0x1f] = cmd_depths[7];
  cmd_depth[0x20] = cmd_depths[0x30];
  cmd_depth[0x21] = cmd_depths[0x31];
  cmd_depth[0x22] = cmd_depths[0x32];
  cmd_depth[0x23] = cmd_depths[0x33];
  cmd_depth[0x24] = cmd_depths[0x34];
  cmd_depth[0x25] = cmd_depths[0x35];
  cmd_depth[0x26] = cmd_depths[0x36];
  cmd_depth[0x27] = cmd_depths[0x37];
  cmd_depth[0x28] = cmd_depths[8];
  cmd_depth[0x29] = cmd_depths[9];
  cmd_depth[0x2a] = cmd_depths[10];
  cmd_depth[0x2b] = cmd_depths[0xb];
  cmd_depth[0x2c] = cmd_depths[0xc];
  cmd_depth[0x2d] = cmd_depths[0xd];
  cmd_depth[0x2e] = cmd_depths[0xe];
  cmd_depth[0x2f] = cmd_depths[0xf];
  cmd_depth[0x30] = cmd_depths[0x38];
  cmd_depth[0x31] = cmd_depths[0x39];
  cmd_depth[0x32] = cmd_depths[0x3a];
  cmd_depth[0x33] = cmd_depths[0x3b];
  cmd_depth[0x34] = cmd_depths[0x3c];
  cmd_depth[0x35] = cmd_depths[0x3d];
  cmd_depth[0x36] = cmd_depths[0x3e];
  cmd_depth[0x37] = cmd_depths[0x3f];
  cmd_depth[0x38] = cmd_depths[0x10];
  cmd_depth[0x39] = cmd_depths[0x11];
  cmd_depth[0x3a] = cmd_depths[0x12];
  cmd_depth[0x3b] = cmd_depths[0x13];
  cmd_depth[0x3c] = cmd_depths[0x14];
  cmd_depth[0x3d] = cmd_depths[0x15];
  cmd_depth[0x3e] = cmd_depths[0x16];
  cmd_depth[0x3f] = cmd_depths[0x17];
  BrotliConvertBitDepthsToSymbols(cmd_depth,0x40,cmd_bits_1);
  cmd_bits[0] = cmd_bits_1[0x18];
  cmd_bits[1] = cmd_bits_1[0x19];
  cmd_bits[2] = cmd_bits_1[0x1a];
  cmd_bits[3] = cmd_bits_1[0x1b];
  cmd_bits[4] = cmd_bits_1[0x1c];
  cmd_bits[5] = cmd_bits_1[0x1d];
  cmd_bits[6] = cmd_bits_1[0x1e];
  cmd_bits[7] = cmd_bits_1[0x1f];
  cmd_bits[8] = cmd_bits_1[0x28];
  cmd_bits[9] = cmd_bits_1[0x29];
  cmd_bits[10] = cmd_bits_1[0x2a];
  cmd_bits[0xb] = cmd_bits_1[0x2b];
  cmd_bits[0xc] = cmd_bits_1[0x2c];
  cmd_bits[0xd] = cmd_bits_1[0x2d];
  cmd_bits[0xe] = cmd_bits_1[0x2e];
  cmd_bits[0xf] = cmd_bits_1[0x2f];
  cmd_bits[0x10] = cmd_bits_1[0x38];
  cmd_bits[0x11] = cmd_bits_1[0x39];
  cmd_bits[0x12] = cmd_bits_1[0x3a];
  cmd_bits[0x13] = cmd_bits_1[0x3b];
  cmd_bits[0x14] = cmd_bits_1[0x3c];
  cmd_bits[0x15] = cmd_bits_1[0x3d];
  cmd_bits[0x16] = cmd_bits_1[0x3e];
  cmd_bits[0x17] = cmd_bits_1[0x3f];
  cmd_bits[0x18] = cmd_bits_1[0];
  cmd_bits[0x19] = cmd_bits_1[1];
  cmd_bits[0x1a] = cmd_bits_1[2];
  cmd_bits[0x1b] = cmd_bits_1[3];
  cmd_bits[0x1c] = cmd_bits_1[4];
  cmd_bits[0x1d] = cmd_bits_1[5];
  cmd_bits[0x1e] = cmd_bits_1[6];
  cmd_bits[0x1f] = cmd_bits_1[7];
  cmd_bits[0x20] = cmd_bits_1[8];
  cmd_bits[0x21] = cmd_bits_1[9];
  cmd_bits[0x22] = cmd_bits_1[10];
  cmd_bits[0x23] = cmd_bits_1[0xb];
  cmd_bits[0x24] = cmd_bits_1[0xc];
  cmd_bits[0x25] = cmd_bits_1[0xd];
  cmd_bits[0x26] = cmd_bits_1[0xe];
  cmd_bits[0x27] = cmd_bits_1[0xf];
  cmd_bits[0x28] = cmd_bits_1[0x10];
  cmd_bits[0x29] = cmd_bits_1[0x11];
  cmd_bits[0x2a] = cmd_bits_1[0x12];
  cmd_bits[0x2b] = cmd_bits_1[0x13];
  cmd_bits[0x2c] = cmd_bits_1[0x14];
  cmd_bits[0x2d] = cmd_bits_1[0x15];
  cmd_bits[0x2e] = cmd_bits_1[0x16];
  cmd_bits[0x2f] = cmd_bits_1[0x17];
  cmd_bits[0x30] = cmd_bits_1[0x20];
  cmd_bits[0x31] = cmd_bits_1[0x21];
  cmd_bits[0x32] = cmd_bits_1[0x22];
  cmd_bits[0x33] = cmd_bits_1[0x23];
  cmd_bits[0x34] = cmd_bits_1[0x24];
  cmd_bits[0x35] = cmd_bits_1[0x25];
  cmd_bits[0x36] = cmd_bits_1[0x26];
  cmd_bits[0x37] = cmd_bits_1[0x27];
  cmd_bits[0x38] = cmd_bits_1[0x30];
  cmd_bits[0x39] = cmd_bits_1[0x31];
  cmd_bits[0x3a] = cmd_bits_1[0x32];
  cmd_bits[0x3b] = cmd_bits_1[0x33];
  cmd_bits[0x3c] = cmd_bits_1[0x34];
  cmd_bits[0x3d] = cmd_bits_1[0x35];
  cmd_bits[0x3e] = cmd_bits_1[0x36];
  cmd_bits[0x3f] = cmd_bits_1[0x37];
  BrotliConvertBitDepthsToSymbols(cmd_depths + 0x40,0x40,cmd_bits + 0x40);
  cmd_depth[8] = '\0';
  cmd_depth[9] = '\0';
  cmd_depth[10] = '\0';
  cmd_depth[0xb] = '\0';
  cmd_depth[0xc] = '\0';
  cmd_depth[0xd] = '\0';
  cmd_depth[0xe] = '\0';
  cmd_depth[0xf] = '\0';
  cmd_depth[0x30] = '\0';
  cmd_depth[0x31] = '\0';
  cmd_depth[0x32] = '\0';
  cmd_depth[0x33] = '\0';
  cmd_depth[0x34] = '\0';
  cmd_depth[0x35] = '\0';
  cmd_depth[0x36] = '\0';
  cmd_depth[0x37] = '\0';
  cmd_depth[0x38] = '\0';
  cmd_depth[0x39] = '\0';
  cmd_depth[0x3a] = '\0';
  cmd_depth[0x3b] = '\0';
  cmd_depth[0x3c] = '\0';
  cmd_depth[0x3d] = '\0';
  cmd_depth[0x3e] = '\0';
  cmd_depth[0x3f] = '\0';
  cmd_depth[0x20] = '\0';
  cmd_depth[0x21] = '\0';
  cmd_depth[0x22] = '\0';
  cmd_depth[0x23] = '\0';
  cmd_depth[0x24] = '\0';
  cmd_depth[0x25] = '\0';
  cmd_depth[0x26] = '\0';
  cmd_depth[0x27] = '\0';
  cmd_depth[0x28] = '\0';
  cmd_depth[0x29] = '\0';
  cmd_depth[0x2a] = '\0';
  cmd_depth[0x2b] = '\0';
  cmd_depth[0x2c] = '\0';
  cmd_depth[0x2d] = '\0';
  cmd_depth[0x2e] = '\0';
  cmd_depth[0x2f] = '\0';
  cmd_depth[0x10] = '\0';
  cmd_depth[0x11] = '\0';
  cmd_depth[0x12] = '\0';
  cmd_depth[0x13] = '\0';
  cmd_depth[0x14] = '\0';
  cmd_depth[0x15] = '\0';
  cmd_depth[0x16] = '\0';
  cmd_depth[0x17] = '\0';
  cmd_depth[0x18] = '\0';
  cmd_depth[0x19] = '\0';
  cmd_depth[0x1a] = '\0';
  cmd_depth[0x1b] = '\0';
  cmd_depth[0x1c] = '\0';
  cmd_depth[0x1d] = '\0';
  cmd_depth[0x1e] = '\0';
  cmd_depth[0x1f] = '\0';
  cmd_depth[0] = cmd_depths[0x18];
  cmd_depth[1] = cmd_depths[0x19];
  cmd_depth[2] = cmd_depths[0x1a];
  cmd_depth[3] = cmd_depths[0x1b];
  cmd_depth[4] = cmd_depths[0x1c];
  cmd_depth[5] = cmd_depths[0x1d];
  cmd_depth[6] = cmd_depths[0x1e];
  cmd_depth[7] = cmd_depths[0x1f];
  cmd_depth[0x40] = cmd_depths[0x20];
  cmd_depth[0x41] = cmd_depths[0x21];
  cmd_depth[0x42] = cmd_depths[0x22];
  cmd_depth[0x43] = cmd_depths[0x23];
  cmd_depth[0x44] = cmd_depths[0x24];
  cmd_depth[0x45] = cmd_depths[0x25];
  cmd_depth[0x46] = cmd_depths[0x26];
  cmd_depth[0x47] = cmd_depths[0x27];
  cmd_depth[0x80] = cmd_depths[0x28];
  cmd_depth[0x81] = cmd_depths[0x29];
  cmd_depth[0x82] = cmd_depths[0x2a];
  cmd_depth[0x83] = cmd_depths[0x2b];
  cmd_depth[0x84] = cmd_depths[0x2c];
  cmd_depth[0x85] = cmd_depths[0x2d];
  cmd_depth[0x86] = cmd_depths[0x2e];
  cmd_depth[0x87] = cmd_depths[0x2f];
  cmd_depth[0xc0] = cmd_depths[0x30];
  cmd_depth[0xc1] = cmd_depths[0x31];
  cmd_depth[0xc2] = cmd_depths[0x32];
  cmd_depth[0xc3] = cmd_depths[0x33];
  cmd_depth[0xc4] = cmd_depths[0x34];
  cmd_depth[0xc5] = cmd_depths[0x35];
  cmd_depth[0xc6] = cmd_depths[0x36];
  cmd_depth[199] = cmd_depths[0x37];
  cmd_depth[0x180] = cmd_depths[0x38];
  cmd_depth[0x181] = cmd_depths[0x39];
  cmd_depth[0x182] = cmd_depths[0x3a];
  cmd_depth[0x183] = cmd_depths[0x3b];
  cmd_depth[0x184] = cmd_depths[0x3c];
  cmd_depth[0x185] = cmd_depths[0x3d];
  cmd_depth[0x186] = cmd_depths[0x3e];
  cmd_depth[0x187] = cmd_depths[0x3f];
  do {
    uVar1 = cmd_depths[lVar10 + 8];
    cmd_depth[lVar10 * 8 + 0x80] = cmd_depths[lVar10];
    cmd_depth[lVar10 * 8 + 0x100] = uVar1;
    *(uint8_t *)(cmd_histo + lVar10 * 2 + -0x40) = cmd_depths[lVar10 + 0x10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  BrotliStoreHuffmanTree(cmd_depth,0x2c0,tree,storage_ix,storage);
  BrotliStoreHuffmanTree(cmd_depths + 0x40,0x40,tree,storage_ix,storage);
  if (num_commands != 0) {
    sVar4 = 0;
    do {
      uVar7 = commands[sVar4] & 0xff;
      uVar5 = commands[sVar4] >> 8;
      uVar8 = *storage_ix;
      uVar9 = cmd_depths[uVar7] + uVar8;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)cmd_bits[uVar7] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      *storage_ix = uVar9;
      uVar3 = StoreCommands::kNumExtraBits[uVar7];
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)uVar5 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = uVar3 + uVar9;
      if ((uVar7 < 0x18) && (iVar6 = uVar5 + StoreCommands::kInsertOffset[uVar7], iVar6 != 0)) {
        uVar8 = *storage_ix;
        do {
          bVar2 = lit_depths[*literals];
          *(ulong *)(storage + (uVar8 >> 3)) =
               (ulong)lit_bits[*literals] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
          uVar8 = uVar8 + bVar2;
          *storage_ix = uVar8;
          literals = literals + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != num_commands);
  }
  return;
}

Assistant:

static void StoreCommands(MemoryManager* m,
                          const uint8_t* literals, const size_t num_literals,
                          const uint32_t* commands, const size_t num_commands,
                          size_t* storage_ix, uint8_t* storage) {
  static const uint32_t kNumExtraBits[128] = {
    0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 12, 14, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8,
    9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
    17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
    0, 1, 2, 3, 4, 5, 6, 8, 10, 14, 18, 26, 34, 50, 66, 98, 130, 194, 322, 578,
    1090, 2114, 6210, 22594,
  };

  uint8_t lit_depths[256];
  uint16_t lit_bits[256];
  uint32_t lit_histo[256] = { 0 };
  uint8_t cmd_depths[128] = { 0 };
  uint16_t cmd_bits[128] = { 0 };
  uint32_t cmd_histo[128] = { 0 };
  size_t i;
  for (i = 0; i < num_literals; ++i) {
    ++lit_histo[literals[i]];
  }
  BrotliBuildAndStoreHuffmanTreeFast(m, lit_histo, num_literals,
                                     /* max_bits = */ 8,
                                     lit_depths, lit_bits,
                                     storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;

  for (i = 0; i < num_commands; ++i) {
    const uint32_t code = commands[i] & 0xFF;
    BROTLI_DCHECK(code < 128);
    ++cmd_histo[code];
  }
  cmd_histo[1] += 1;
  cmd_histo[2] += 1;
  cmd_histo[64] += 1;
  cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(cmd_histo, cmd_depths, cmd_bits,
                                 storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xFF;
    const uint32_t extra = cmd >> 8;
    BROTLI_DCHECK(code < 128);
    BrotliWriteBits(cmd_depths[code], cmd_bits[code], storage_ix, storage);
    BrotliWriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      uint32_t j;
      for (j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        BrotliWriteBits(lit_depths[lit], lit_bits[lit], storage_ix, storage);
        ++literals;
      }
    }
  }
}